

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyServer.cpp
# Opt level: O2

void __thiscall ProxyServer::ProxyServer(ProxyServer *this)

{
  uint8_t *puVar1;
  
  (this->m_stopCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_stopCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_stopCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_stopCall).super__Function_base._M_functor + 8) = 0;
  (this->m_client)._M_t.
  super___uniq_ptr_impl<net_uv::TCPClient,_std::default_delete<net_uv::TCPClient>_>._M_t.
  super__Tuple_impl<0UL,_net_uv::TCPClient_*,_std::default_delete<net_uv::TCPClient>_>.
  super__Head_base<0UL,_net_uv::TCPClient_*,_false>._M_head_impl = (TCPClient *)0x0;
  (this->m_pipe)._M_t.super___uniq_ptr_impl<net_uv::Server,_std::default_delete<net_uv::Server>_>.
  _M_t.super__Tuple_impl<0UL,_net_uv::Server_*,_std::default_delete<net_uv::Server>_>.
  super__Head_base<0UL,_net_uv::Server_*,_false>._M_head_impl = (Server *)0x0;
  (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>._M_t.
  super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
  super__Head_base<0UL,_Cypher_*,_false>._M_head_impl = (Cypher *)0x0;
  (this->m_dnsResolver)._M_t.super___uniq_ptr_impl<DnsResolver,_std::default_delete<DnsResolver>_>.
  _M_t.super__Tuple_impl<0UL,_DnsResolver_*,_std::default_delete<DnsResolver>_>.
  super__Head_base<0UL,_DnsResolver_*,_false>._M_head_impl = (DnsResolver *)0x0;
  this->m_runStatus = STOP;
  net_uv::UVLoop::UVLoop(&this->m_loop);
  net_uv::UVTimer::UVTimer(&this->m_update);
  net_uv::UVTimer::UVTimer(&this->m_clsTimer);
  this->m_recvBuffer = (char *)0x0;
  this->m_recvBufLen = 0;
  (this->m_sessionDataMap)._M_h._M_buckets = &(this->m_sessionDataMap)._M_h._M_single_bucket;
  (this->m_sessionDataMap)._M_h._M_bucket_count = 1;
  (this->m_sessionDataMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_sessionDataMap)._M_h._M_element_count = 0;
  (this->m_sessionDataMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_sessionDataMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_sessionDataMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (uint8_t *)malloc(0x40000);
  this->m_sendBuffer = puVar1;
  return;
}

Assistant:

ProxyServer::ProxyServer()
	: m_stopCall(nullptr)
	, m_runStatus(RUN_STATUS::STOP)
	, m_recvBuffer(NULL)
	, m_recvBufLen(0)
{
	m_sendBuffer = (uint8_t*)fc_malloc(MSG_MAX_SIZE);
}